

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

bool __thiscall sf::RenderTarget::setActive(RenderTarget *this,bool active)

{
  bool bVar1;
  mapped_type_conflict1 *pmVar2;
  pointer ppVar3;
  byte in_SIL;
  long in_RDI;
  iterator iter;
  Uint64 contextId;
  Lock lock;
  map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
  *in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  unsigned_long_long uVar4;
  Lock *in_stack_ffffffffffffff80;
  mapped_type_conflict1 mVar5;
  key_type *in_stack_ffffffffffffffa8;
  map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
  *in_stack_ffffffffffffffb0;
  _Self local_48;
  _Self local_40;
  _Self local_38 [3];
  Uint64 local_20;
  byte local_9;
  
  local_9 = in_SIL & 1;
  Lock::Lock(in_stack_ffffffffffffff80,(Mutex *)in_stack_ffffffffffffff78._M_node);
  local_20 = Context::getActiveContextId();
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x2c2783);
  if ((local_9 & 1) == 0) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_38,&local_48);
    if (bVar1) {
      in_stack_ffffffffffffff70 =
           std::
           map<unsigned_long_long,unsigned_long_long,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_long_long>>>
           ::erase_abi_cxx11_(in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff78);
    }
    *(undefined1 *)(in_RDI + 0x158) = 0;
  }
  else {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator==(local_38,&local_40);
    if (bVar1) {
      mVar5 = *(mapped_type_conflict1 *)(in_RDI + 0x1d8);
      pmVar2 = std::
               map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
               ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *pmVar2 = mVar5;
      *(undefined1 *)(in_RDI + 0x159) = 0;
      *(undefined1 *)(in_RDI + 0x158) = 0;
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>
                           *)0x2c283d);
      if (ppVar3->second != *(unsigned_long_long *)(in_RDI + 0x1d8)) {
        uVar4 = *(unsigned_long_long *)(in_RDI + 0x1d8);
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>
                             *)0x2c286a);
        ppVar3->second = uVar4;
        *(undefined1 *)(in_RDI + 0x158) = 0;
      }
    }
  }
  Lock::~Lock((Lock *)in_stack_ffffffffffffff70._M_node);
  return true;
}

Assistant:

bool RenderTarget::setActive(bool active)
{
    // Mark this RenderTarget as active or no longer active in the tracking map
    {
        sf::Lock lock(RenderTargetImpl::mutex);

        Uint64 contextId = Context::getActiveContextId();

        using RenderTargetImpl::contextRenderTargetMap;
        RenderTargetImpl::ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(contextId);

        if (active)
        {
            if (iter == contextRenderTargetMap.end())
            {
                contextRenderTargetMap[contextId] = m_id;

                m_cache.glStatesSet = false;
                m_cache.enable = false;
            }
            else if (iter->second != m_id)
            {
                iter->second = m_id;

                m_cache.enable = false;
            }
        }
        else
        {
            if (iter != contextRenderTargetMap.end())
                contextRenderTargetMap.erase(iter);

            m_cache.enable = false;
        }
    }

    return true;
}